

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_casts.cpp
# Opt level: O1

BoundCastInfo *
duckdb::EnumEnumCastSwitch<unsigned_char>
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  PhysicalType PVar1;
  InternalException *this;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_58;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_50;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_48;
  string local_40;
  
  PVar1 = target->physical_type_;
  if (PVar1 == UINT32) {
    local_58._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,EnumEnumCast<unsigned_char,unsigned_int>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_58,(init_cast_local_state_t)0x0);
    if (local_58._M_head_impl != (BoundCastData *)0x0) {
      (*(local_58._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  else if (PVar1 == UINT16) {
    local_50._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,EnumEnumCast<unsigned_char,unsigned_short>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_50,(init_cast_local_state_t)0x0);
    if (local_50._M_head_impl != (BoundCastData *)0x0) {
      (*(local_50._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  else {
    if (PVar1 != UINT8) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "ENUM can only have unsigned integers (except UINT64) as physical types","");
      InternalException::InternalException(this,&local_40);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,EnumEnumCast<unsigned_char,unsigned_char>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_48,(init_cast_local_state_t)0x0);
    if (local_48._M_head_impl != (BoundCastData *)0x0) {
      (*(local_48._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo EnumEnumCastSwitch(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	switch (target.InternalType()) {
	case PhysicalType::UINT8:
		return EnumEnumCast<SRC_TYPE, uint8_t>;
	case PhysicalType::UINT16:
		return EnumEnumCast<SRC_TYPE, uint16_t>;
	case PhysicalType::UINT32:
		return EnumEnumCast<SRC_TYPE, uint32_t>;
	default:
		throw InternalException("ENUM can only have unsigned integers (except UINT64) as physical types");
	}
}